

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_remove_run_compression(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  undefined8 *c_00;
  container_t *c_01;
  roaring_array_t *in_RDI;
  container_t *c1_1;
  int32_t card_1;
  container_t *c1;
  int32_t card;
  run_container_t *truec;
  container_t *c;
  uint8_t type_after;
  uint8_t type_original;
  int i;
  _Bool answer;
  run_container_t *in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  uint8_t in_stack_ffffffffffffffee;
  uint8_t in_stack_ffffffffffffffef;
  int local_10;
  _Bool local_9;
  
  local_9 = false;
  for (local_10 = 0; local_10 < in_RDI->size; local_10 = local_10 + 1) {
    c_00 = (undefined8 *)
           ra_get_container_at_index(in_RDI,(uint16_t)local_10,&stack0xffffffffffffffef);
    uVar1 = get_container_type(c_00,in_stack_ffffffffffffffef);
    if (uVar1 == '\x03') {
      local_9 = true;
      if (in_stack_ffffffffffffffef == '\x04') {
        in_stack_ffffffffffffffd8 = (uint8_t *)*c_00;
        run_container_cardinality(in_stack_ffffffffffffffb8);
        c_01 = convert_to_bitset_or_array_container
                         ((run_container_t *)
                          CONCAT17(in_stack_ffffffffffffffef,
                                   CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)),
                          (int32_t)((ulong)c_00 >> 0x20),in_stack_ffffffffffffffd8);
        shared_container_free((shared_container_t *)0x10b0d9);
        ra_set_container_at_index(in_RDI,local_10,c_01,in_stack_ffffffffffffffee);
      }
      else {
        run_container_cardinality(in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffb8 =
             (run_container_t *)
             convert_to_bitset_or_array_container
                       ((run_container_t *)
                        CONCAT17(in_stack_ffffffffffffffef,
                                 CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)),
                        (int32_t)((ulong)c_00 >> 0x20),in_stack_ffffffffffffffd8);
        run_container_free((run_container_t *)0x10b122);
        ra_set_container_at_index
                  (in_RDI,local_10,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffee);
      }
    }
  }
  return local_9;
}

Assistant:

bool roaring_bitmap_remove_run_compression(roaring_bitmap_t *r) {
    bool answer = false;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original, type_after;
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        if (get_container_type(c, type_original) == RUN_CONTAINER_TYPE) {
            answer = true;
            if (type_original == SHARED_CONTAINER_TYPE) {
                run_container_t *truec = CAST_run(CAST_shared(c)->container);
                int32_t card = run_container_cardinality(truec);
                container_t *c1 = convert_to_bitset_or_array_container(
                    truec, card, &type_after);
                shared_container_free(CAST_shared(c));  // frees run as needed
                ra_set_container_at_index(&r->high_low_container, i, c1,
                                          type_after);

            } else {
                int32_t card = run_container_cardinality(CAST_run(c));
                container_t *c1 = convert_to_bitset_or_array_container(
                    CAST_run(c), card, &type_after);
                run_container_free(CAST_run(c));
                ra_set_container_at_index(&r->high_low_container, i, c1,
                                          type_after);
            }
        }
    }
    return answer;
}